

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Futex.cpp
# Opt level: O2

int nativeFutexWake(void *addr,int count,uint32_t wakeMask)

{
  int iVar1;
  long lVar2;
  
  lVar2 = syscall(0xca,addr,0x8a,count,0,0,wakeMask);
  iVar1 = (int)lVar2;
  if ((int)lVar2 < 1) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int nativeFutexWake(const void *addr, int count, uint32_t wakeMask) {
#ifndef PSHARED
    int rv = syscall(
            __NR_futex,
            addr, /* addr1 */
            FUTEX_WAKE_BITSET | FUTEX_PRIVATE_FLAG, /* op */
            count, /* val */
            nullptr, /* timeout */
            nullptr, /* addr2 */
            wakeMask); /* val3 */
#else
    int rv = syscall(
                __NR_futex,
                addr, /* addr1 */
                FUTEX_WAKE_BITSET, /* op */
                count, /* val */
                nullptr, /* timeout */
                nullptr, /* addr2 */
                wakeMask); /* val3 */
#endif

    /* NOTE: we ignore errors on wake for the case of a futex
       guarding its own destruction, similar to this
       glibc bug with sem_post/sem_wait:
       https://sourceware.org/bugzilla/show_bug.cgi?id=12674 */
    if (rv < 0) {
        return 0;
    }
    return rv;
}